

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.h
# Opt level: O0

Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> * __thiscall
COLLADASaxFWL::SourceArrayLoader::
beginArray<COLLADASaxFWL::Source<COLLADASaxFWL::BaseArrayElement<float>,(COLLADASaxFWL::SourceBase::DataType)2>>
          (SourceArrayLoader *this,uint64 count,ParserChar *id)

{
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *this_00;
  BaseArrayElement<float> *this_01;
  char *in_RDX;
  SourceBase *in_RDI;
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *newSource;
  String *in_stack_ffffffffffffffb8;
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *capacity;
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2>
  *in_stack_ffffffffffffffd0;
  
  this_00 = (Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2>
             *)operator_new(0xe0);
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2>::Source
            (in_stack_ffffffffffffffd0);
  capacity = this_00;
  this_01 = Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2>::
            getArrayElement(this_00);
  BaseArrayElement<float>::getValues(this_01);
  COLLADAFW::ArrayPrimitiveType<float>::allocMemory
            ((ArrayPrimitiveType<float> *)in_stack_ffffffffffffffd0,(size_t)capacity,
             (int)((ulong)in_RDI >> 0x20));
  SourceBase::setId(in_RDI,in_stack_ffffffffffffffb8);
  (in_RDI->mLoadedInputElements).mCount = (size_t)this_00;
  if (in_RDX != (char *)0x0) {
    std::__cxx11::string::operator=
              ((string *)
               &(in_RDI->mAccessor).
                super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RDX);
  }
  return this_00;
}

Assistant:

SourceType* SourceArrayLoader::beginArray( uint64 count,  const ParserChar* id )
	{
		SourceType* newSource = new SourceType();
		newSource->getArrayElement().getValues().allocMemory((size_t)count);
		newSource->setId(mCurrentSourceId);
		mCurrentSoure = newSource;
		if ( id )
			mCurrentArrayId = id;
		return newSource;
	}